

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_engine.cpp
# Opt level: O3

int __thiscall
zmq::udp_engine_t::set_udp_multicast_iface
          (udp_engine_t *this,fd_t s_,bool is_ipv6_,udp_address_t *addr_)

{
  int iVar1;
  undefined8 in_RAX;
  ip_addr_t *piVar2;
  undefined8 *__optval;
  undefined7 in_register_00000011;
  int __level;
  in_addr bind_addr;
  int bind_if;
  undefined8 local_18;
  
  __optval = &local_18;
  local_18 = in_RAX;
  if ((int)CONCAT71(in_register_00000011,is_ipv6_) == 0) {
    piVar2 = udp_address_t::bind_addr(addr_);
    local_18 = CONCAT44(local_18._4_4_,(piVar2->ipv6).sin6_flowinfo);
    if ((piVar2->ipv6).sin6_flowinfo == 0) goto LAB_0019e6f0;
    __level = 0;
    iVar1 = 0x20;
  }
  else {
    iVar1 = udp_address_t::bind_if(addr_);
    local_18 = CONCAT44(iVar1,(undefined4)local_18);
    if (iVar1 < 1) {
LAB_0019e6f0:
      iVar1 = 0;
      goto LAB_0019e6f2;
    }
    __optval = (undefined8 *)((long)&local_18 + 4);
    __level = 0x29;
    iVar1 = 0x11;
  }
  iVar1 = setsockopt(s_,__level,iVar1,__optval,4);
LAB_0019e6f2:
  assert_success_or_recoverable(s_,iVar1);
  return iVar1;
}

Assistant:

int zmq::udp_engine_t::set_udp_multicast_iface (fd_t s_,
                                                bool is_ipv6_,
                                                const udp_address_t *addr_)
{
    int rc = 0;

    if (is_ipv6_) {
        int bind_if = addr_->bind_if ();

        if (bind_if > 0) {
            //  If a bind interface is provided we tell the
            //  kernel to use it to send multicast packets
            rc = setsockopt (s_, IPPROTO_IPV6, IPV6_MULTICAST_IF,
                             reinterpret_cast<char *> (&bind_if),
                             sizeof (bind_if));
        }
    } else {
        struct in_addr bind_addr = addr_->bind_addr ()->ipv4.sin_addr;

        if (bind_addr.s_addr != INADDR_ANY) {
            rc = setsockopt (s_, IPPROTO_IP, IP_MULTICAST_IF,
                             reinterpret_cast<char *> (&bind_addr),
                             sizeof (bind_addr));
        }
    }

    assert_success_or_recoverable (s_, rc);
    return rc;
}